

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_wait_mipsel(CPUMIPSState_conflict2 *env)

{
  CPUMIPSState_conflict2 *__mptr;
  
  env[-1].tcs[0xc].gpr[4] = 1;
  cpu_reset_interrupt((CPUState *)(env[-4].tcs[0xd].mmr + 5),0x100);
  do_raise_exception(env,0x10001,0);
}

Assistant:

void helper_wait(CPUMIPSState *env)
{
    CPUState *cs = env_cpu(env);

    cs->halted = 1;
    cpu_reset_interrupt(cs, CPU_INTERRUPT_WAKE);
    /*
     * Last instruction in the block, PC was updated before
     * - no need to recover PC and icount.
     */
    raise_exception(env, EXCP_HLT);
}